

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

void __thiscall flow::RetInstr::RetInstr(RetInstr *this,Value *result)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_49;
  Value *local_48;
  iterator local_40;
  size_type local_38;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_30;
  Value *local_18;
  Value *result_local;
  RetInstr *this_local;
  
  local_40 = &local_48;
  local_38 = 1;
  local_48 = result;
  local_18 = result;
  result_local = (Value *)this;
  std::allocator<flow::Value_*>::allocator(&local_49);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_30,__l,&local_49);
  TerminateInstr::TerminateInstr(&this->super_TerminateInstr,&local_30);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_30);
  std::allocator<flow::Value_*>::~allocator(&local_49);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__RetInstr_002d3370;
  return;
}

Assistant:

RetInstr::RetInstr(Value* result) : TerminateInstr({result}) {}